

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O1

Graph * createRandomGraph(Graph *__return_storage_ptr__,unsigned_long verices,unsigned_long edges,
                         int cost_min,int cost_max)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  type *ptVar3;
  Graph *pGVar4;
  Graph *pGVar5;
  int iVar6;
  value_type vVar7;
  type extraout_RDX;
  type tVar8;
  type extraout_RDX_00;
  type tVar9;
  long lVar10;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Var11;
  type *ptVar12;
  EdgeIterator ei;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairlist;
  graph_type *cg;
  default_add_edge_visitor vis;
  Graph G;
  EdgeIterator ei_end;
  mt19937 gen;
  undefined8 uStack_b98;
  undefined1 local_b90;
  undefined7 uStack_b8f;
  undefined1 uStack_b88;
  undefined7 uStack_b87;
  char cStack_b80;
  undefined8 *local_b78;
  value_type local_b70;
  undefined8 *local_b68;
  value_type local_b60;
  long local_b58;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_b48;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Stack_b40;
  long local_b38;
  Graph *local_b28;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_b20;
  undefined1 *local_a90;
  undefined8 *local_a88;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_a80;
  undefined8 local_a48;
  undefined1 local_a40;
  undefined7 uStack_a3f;
  undefined1 uStack_a38;
  undefined8 uStack_a37;
  undefined8 *local_a28;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_a80,(no_property *)&local_9f8);
  uStack_b88 = 0;
  uStack_b87 = 0;
  cStack_b80 = '\0';
  uStack_b98 = 0;
  local_b90 = 0;
  uStack_b8f = 0;
  uStack_a38 = 0;
  uStack_a37 = 0;
  local_a48 = 0;
  local_a40 = 0;
  uStack_a3f = 0;
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  boost::
  generate_random_graph1<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
            (&local_a80,verices,edges,&local_9f8,false,false);
  tVar9 = (type)&local_b20;
  boost::
  make_connected<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,boost::default_add_edge_visitor>
            (&local_a80);
  local_b20.first.vEnd.m_value =
       (long)local_a80.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a80.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_b48._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  _Stack_b40._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_b38 = 0;
  if (local_a80.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_a80.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_b20.first.vCurr.m_value = 0;
    local_b20.first.edges.super_type.m_initialized = false;
    tVar8 = extraout_RDX;
  }
  else {
    tVar8 = *(type *)local_a80.super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    tVar9 = *(type *)((long)local_a80.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8);
    if (tVar9 == tVar8) {
      ptVar12 = (type *)((long)local_a80.super_type.m_vertices.
                               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x28);
      local_b20.first.vCurr.m_value = 0;
      do {
        if (local_b20.first.vEnd.m_value - 1 == local_b20.first.vCurr.m_value) {
          local_b20.first.edges.super_type.m_initialized = false;
          local_b20.first.vCurr.m_value = local_b20.first.vEnd.m_value;
          goto LAB_0010c70d;
        }
        tVar8 = (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start;
        tVar9 = *ptVar12;
        ptVar12 = ptVar12 + 4;
        local_b20.first.vCurr.m_value = local_b20.first.vCurr.m_value + 1;
      } while (tVar9 == tVar8);
    }
    else {
      local_b20.first.vCurr.m_value = 0;
    }
    local_b20.first.edges.super_type.m_initialized = true;
  }
LAB_0010c70d:
  local_b20.first.vBegin.m_value = 0;
  if (local_b20.first.edges.super_type.m_initialized) {
    local_b20.first.edges.super_type.m_storage.dummy_.aligner_ = tVar8;
    local_b20.first.edges.super_type.m_storage.dummy_._8_8_ = local_b20.first.vCurr.m_value;
    local_b20.first.edges.super_type.m_storage.dummy_._16_8_ = tVar9;
    local_b20.first.edges.super_type.m_storage.dummy_._24_8_ = local_b20.first.vCurr.m_value;
  }
  local_b20.second.vBegin.m_value = 0;
  local_b20.second.edges.super_type.m_initialized = false;
  local_a88 = &local_a48;
  local_b20.first.m_g = &local_a80;
  local_b20.second.vCurr.m_value = local_b20.first.vEnd.m_value;
  local_b20.second.vEnd.m_value = local_b20.first.vEnd.m_value;
  local_b20.second.m_g = &local_a80;
  local_a90 = (undefined1 *)&uStack_b98;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_a90,&local_b20);
  if (local_b20.second.edges.super_type.m_initialized == true) {
    local_b20.second.edges.super_type.m_initialized = false;
  }
  if (local_b20.first.edges.super_type.m_initialized == true) {
    local_b20.first.edges.super_type.m_initialized = false;
  }
  local_b28 = __return_storage_ptr__;
LAB_0010c7d9:
  do {
    pGVar5 = local_b28;
    if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_a3f,local_a40)) {
      if (CONCAT71(uStack_b8f,local_b90) != CONCAT71(uStack_b87,uStack_b88)) {
        if ((cStack_b80 == '\0') || (uStack_a37._7_1_ == '\0')) goto LAB_0010cb8c;
        if (local_b78 != local_a28) goto LAB_0010c81f;
      }
      _Var11._M_current = local_b48._M_current;
      boost::
      adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
      ::
      adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                  *)local_b28,local_b48,_Stack_b40,
                 (long)local_a80.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a80.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,0,(no_property *)&local_b20);
      ptVar12 = (type *)(pGVar5->super_type).m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      ptVar3 = (type *)(pGVar5->super_type).m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      local_b20.first.vEnd.m_value = (long)ptVar3 - (long)ptVar12 >> 5;
      local_a88 = &local_a48;
      if (ptVar3 == ptVar12) {
        local_b20.first.vCurr.m_value = 0;
        local_b20.first.edges.super_type.m_initialized = false;
        tVar9 = extraout_RDX_00;
        goto LAB_0010c973;
      }
      tVar9 = *ptVar12;
      _Var11._M_current = *(pair<unsigned_long,_unsigned_long> **)(ptVar12 + 1);
      if ((type)_Var11._M_current == tVar9) {
        ptVar12 = ptVar12 + 5;
        local_b20.first.vCurr.m_value = 0;
        break;
      }
      local_b20.first.vCurr.m_value = 0;
      goto LAB_0010c969;
    }
LAB_0010c81f:
    if (cStack_b80 == '\0') goto LAB_0010cb8c;
    local_b20.first.vBegin.m_value = local_b70;
    local_a90 = (undefined1 *)*local_b78;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long,unsigned_long>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_b48,(unsigned_long *)&local_b20,(unsigned_long *)&local_a90);
    if (cStack_b80 == '\0') {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_b78 = local_b78 + 2;
    if (local_b78 == local_b68) {
      vVar7 = CONCAT71(uStack_b8f,local_b90);
      lVar10 = vVar7 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_b87,uStack_b88) - 1U == vVar7) {
          local_b90 = uStack_b88;
          uStack_b8f = uStack_b87;
          goto LAB_0010c7d9;
        }
        puVar1 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + -8 + lVar10);
        puVar2 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        vVar7 = vVar7 + 1;
      } while (puVar2 == puVar1);
      local_b90 = (undefined1)vVar7;
      uStack_b8f = (undefined7)(vVar7 >> 8);
      local_b78 = puVar1;
      local_b70 = vVar7;
      local_b68 = puVar2;
      local_b60 = vVar7;
    }
  } while( true );
  while( true ) {
    tVar9 = (type)((_Vector_impl_data *)(ptVar12 + -1))->_M_start;
    _Var11._M_current = *(pair<unsigned_long,_unsigned_long> **)ptVar12;
    ptVar12 = ptVar12 + 4;
    local_b20.first.vCurr.m_value = local_b20.first.vCurr.m_value + 1;
    if ((type)_Var11._M_current != tVar9) break;
    if (local_b20.first.vEnd.m_value - 1 == local_b20.first.vCurr.m_value) {
      local_b20.first.edges.super_type.m_initialized = false;
      local_b20.first.vCurr.m_value = local_b20.first.vEnd.m_value;
      goto LAB_0010c973;
    }
  }
LAB_0010c969:
  local_b20.first.edges.super_type.m_initialized = true;
LAB_0010c973:
  local_b20.first.vBegin.m_value = 0;
  if (local_b20.first.edges.super_type.m_initialized) {
    local_b20.first.edges.super_type.m_storage.dummy_.aligner_ = tVar9;
    local_b20.first.edges.super_type.m_storage.dummy_._8_8_ = local_b20.first.vCurr.m_value;
    local_b20.first.edges.super_type.m_storage.dummy_._16_8_ = _Var11._M_current;
    local_b20.first.edges.super_type.m_storage.dummy_._24_8_ = local_b20.first.vCurr.m_value;
  }
  local_b20.first.m_g = pGVar5;
  local_b20.second.vBegin.m_value = 0;
  local_b20.second.edges.super_type.m_initialized = false;
  local_b20.second.m_g = pGVar5;
  local_b20.second.vCurr.m_value = local_b20.first.vEnd.m_value;
  local_b20.second.vEnd.m_value = local_b20.first.vEnd.m_value;
  local_a90 = (undefined1 *)&uStack_b98;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_a90,&local_b20);
  if (local_b20.second.edges.super_type.m_initialized == true) {
    local_b20.second.edges.super_type.m_initialized = false;
  }
  if (local_b20.first.edges.super_type.m_initialized == true) {
    local_b20.first.edges.super_type.m_initialized = false;
  }
LAB_0010cade:
  do {
    if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_a3f,local_a40)) {
      if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_b87,uStack_b88)) {
LAB_0010cafc:
        if (local_b48._M_current != (pair<unsigned_long,_unsigned_long> *)0x0) {
          operator_delete(local_b48._M_current,local_b38 - (long)local_b48._M_current);
        }
        if (uStack_a37._7_1_ == '\x01') {
          uStack_a37 = uStack_a37 & 0xffffffffffffff;
        }
        if (cStack_b80 == '\x01') {
          cStack_b80 = '\0';
        }
        if (local_a80.m_property.px != (no_property *)0x0) {
          operator_delete(local_a80.m_property.px,1);
        }
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_a80.super_type.m_vertices);
        while ((Graph *)local_a80.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next != &local_a80) {
          pGVar4 = (Graph *)(((Graph *)
                             local_a80.super_type.m_edges.
                             super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(local_a80.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,0x28);
          local_a80.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar4;
        }
        return pGVar5;
      }
      if ((cStack_b80 == '\0') || (uStack_a37._7_1_ == '\0')) {
LAB_0010cb8c:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_b78 == local_a28) goto LAB_0010cafc;
    }
    iVar6 = randomRange(cost_min,cost_max);
    if (cStack_b80 == '\0') goto LAB_0010cb8c;
    *(int *)local_b78[1] = iVar6;
    local_b78 = local_b78 + 2;
    if (local_b78 == local_b68) {
      vVar7 = CONCAT71(uStack_b8f,local_b90);
      lVar10 = vVar7 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_b87,uStack_b88) - 1U == vVar7) {
          local_b90 = uStack_b88;
          uStack_b8f = uStack_b87;
          goto LAB_0010cade;
        }
        puVar1 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + -8 + lVar10);
        puVar2 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        vVar7 = vVar7 + 1;
      } while (puVar2 == puVar1);
      local_b90 = (undefined1)vVar7;
      uStack_b8f = (undefined7)(vVar7 >> 8);
      local_b78 = puVar1;
      local_b70 = vVar7;
      local_b68 = puVar2;
      local_b60 = vVar7;
    }
  } while( true );
}

Assistant:

Graph createRandomGraph(unsigned long verices, unsigned long edges, int cost_min, int cost_max)
{
    Graph G;
    EdgeIterator ei, ei_end;

    // Generating Random connected graph
    boost::mt19937 gen;
    generate_random_graph(G, verices, edges, gen, false, false);
    boost::make_connected<Graph>(G);

    // Converting to EdgeList graph
    std::vector<std::pair<Graph::vertex_descriptor, Graph::vertex_descriptor> > pairlist;
    for (boost::tie(ei, ei_end) = boost::edges(G); ei!=ei_end; ++ei) {
        pairlist.emplace_back(source(*ei, G), target(*ei, G));
    }
    Graph g(pairlist.begin(), pairlist.end(), num_vertices(G));

    // Adding weights
    for(boost::tie(ei, ei_end) = boost::edges(g); ei != ei_end; ++ei) {
        g[*ei].weight = randomRange(cost_min, cost_max);
    }

    return g;
}